

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O2

void __thiscall
llvm::formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
formatv_object(formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>
               *this,StringRef Fmt,
              tuple<llvm::detail::provider_format_adapter<unsigned_long>_> *Params)

{
  _Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  local_38;
  create_adapters local_19;
  
  formatv_object_base::formatv_object_base(&this->super_formatv_object_base,Fmt,1);
  (this->Parameters).super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>_>.
  super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01128648;
  (this->Parameters).super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>_>.
  super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  Item = (Params->super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>_>).
         super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
         _M_head_impl.Item;
  formatv_object_base::create_adapters::operator()
            ((vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
              *)&local_38,&local_19,(provider_format_adapter<unsigned_long> *)&this->Parameters);
  std::vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>::
  _M_move_assign(&(this->super_formatv_object_base).Adapters,&local_38);
  std::_Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

formatv_object(StringRef Fmt, Tuple &&Params)
      : formatv_object_base(Fmt, std::tuple_size<Tuple>::value),
        Parameters(std::move(Params)) {
    Adapters = apply_tuple(create_adapters(), Parameters);
  }